

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O2

void __thiscall icu_63::UVector32::removeElementAt(UVector32 *this,int32_t index)

{
  int32_t *piVar1;
  ulong uVar2;
  int iVar3;
  
  if (-1 < index) {
    piVar1 = this->elements;
    for (uVar2 = (ulong)(uint)index; iVar3 = this->count + -1, (int)uVar2 < iVar3; uVar2 = uVar2 + 1
        ) {
      piVar1[uVar2] = piVar1[uVar2 + 1];
    }
    this->count = iVar3;
  }
  return;
}

Assistant:

void UVector32::removeElementAt(int32_t index) {
    if (index >= 0) {
        for (int32_t i=index; i<count-1; ++i) {
            elements[i] = elements[i+1];
        }
        --count;
    }
}